

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O2

void hydro_random_buf(void *out,size_t out_len)

{
  uint8_t *state_u8;
  long lVar1;
  undefined8 uVar2;
  ulong uVar3;
  undefined8 *puVar4;
  long *in_FS_OFFSET;
  bool bVar5;
  
  hydro_random_ensure_initialized();
  lVar1 = *in_FS_OFFSET;
  uVar3 = out_len >> 4;
  state_u8 = (uint8_t *)(lVar1 + -0x40);
  puVar4 = (undefined8 *)out;
  while (bVar5 = uVar3 != 0, uVar3 = uVar3 - 1, bVar5) {
    gimli_core_u8(state_u8,'\0');
    uVar2 = *(undefined8 *)(lVar1 + -0x38);
    *puVar4 = *(undefined8 *)state_u8;
    puVar4[1] = uVar2;
    puVar4 = puVar4 + 2;
  }
  if ((out_len & 0xf) != 0) {
    gimli_core_u8(state_u8,'\0');
    mem_cpy((void *)((long)out + (out_len & 0xfffffffffffffff0)),state_u8,out_len & 0xf);
  }
  hydro_random_ratchet();
  return;
}

Assistant:

void
hydro_random_buf(void *out, size_t out_len)
{
    uint8_t *p = (uint8_t *) out;
    size_t   i;
    size_t   leftover;

    hydro_random_ensure_initialized();
    for (i = 0; i < out_len / gimli_RATE; i++) {
        gimli_core_u8(hydro_random_context.state, 0);
        memcpy(p + i * gimli_RATE, hydro_random_context.state, gimli_RATE);
    }
    leftover = out_len % gimli_RATE;
    if (leftover != 0) {
        gimli_core_u8(hydro_random_context.state, 0);
        mem_cpy(p + i * gimli_RATE, hydro_random_context.state, leftover);
    }
    hydro_random_ratchet();
}